

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O0

void If_LibBoxWrite(char *pFileName,If_LibBox_t *p)

{
  FILE *__stream;
  FILE *pFile;
  If_LibBox_t *p_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
  }
  else {
    If_LibBoxPrint((FILE *)__stream,p);
    fclose(__stream);
  }
  return;
}

Assistant:

void If_LibBoxWrite( char * pFileName, If_LibBox_t * p )
{
    FILE * pFile;
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
    If_LibBoxPrint( pFile, p );
    fclose( pFile );
}